

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

bool bssl::ssl_send_tls12_certificate(SSL_HANDSHAKE *hs)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  SSL *pSVar1;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var2;
  bool bVar3;
  int iVar4;
  cbb_st *pcVar5;
  pointer psVar6;
  pointer sk;
  CRYPTO_BUFFER *pCVar7;
  uint8_t *data;
  size_t len;
  CRYPTO_BUFFER *buffer;
  size_t i;
  stack_st_CRYPTO_BUFFER *chain;
  undefined1 local_d8 [8];
  CBB cert;
  CBB certs;
  CBB body;
  ScopedCBB cbb;
  SSL_HANDSHAKE *hs_local;
  
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  pSVar1 = hs->ssl;
  p_Var2 = pSVar1->method->init_message;
  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  bVar3 = (*p_Var2)(pSVar1,pcVar5,(CBB *)((long)&certs.u + 0x18),'\v');
  if ((bVar3) &&
     (iVar4 = CBB_add_u24_length_prefixed
                        ((CBB *)((long)&certs.u + 0x18),(CBB *)((long)&cert.u + 0x18)), iVar4 != 0))
  {
    bVar3 = std::operator!=(&hs->credential,(nullptr_t)0x0);
    if (bVar3) {
      psVar6 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                         (&hs->credential);
      if (psVar6->type != kX509) {
        __assert_fail("hs->credential->type == SSLCredentialType::kX509",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0x1d8,"bool bssl::ssl_send_tls12_certificate(SSL_HANDSHAKE *)");
      }
      psVar6 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                         (&hs->credential);
      sk = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&psVar6->chain);
      for (buffer = (CRYPTO_BUFFER *)0x0; pCVar7 = (CRYPTO_BUFFER *)sk_CRYPTO_BUFFER_num(sk),
          buffer < pCVar7; buffer = (CRYPTO_BUFFER *)((long)&buffer->pool + 1)) {
        pCVar7 = sk_CRYPTO_BUFFER_value(sk,(size_t)buffer);
        iVar4 = CBB_add_u24_length_prefixed((CBB *)((long)&cert.u + 0x18),(CBB *)local_d8);
        if (iVar4 == 0) {
LAB_00176e1d:
          hs_local._7_1_ = false;
          goto LAB_00176e98;
        }
        data = CRYPTO_BUFFER_data(pCVar7);
        len = CRYPTO_BUFFER_len(pCVar7);
        iVar4 = CBB_add_bytes((CBB *)local_d8,data,len);
        if (iVar4 == 0) goto LAB_00176e1d;
      }
    }
    pSVar1 = hs->ssl;
    pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&body.u + 0x18));
    hs_local._7_1_ = ssl_add_message_cbb(pSVar1,pcVar5);
  }
  else {
    hs_local._7_1_ = false;
  }
LAB_00176e98:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
  return hs_local._7_1_;
}

Assistant:

bool ssl_send_tls12_certificate(SSL_HANDSHAKE *hs) {
  ScopedCBB cbb;
  CBB body, certs, cert;
  if (!hs->ssl->method->init_message(hs->ssl, cbb.get(), &body,
                                     SSL3_MT_CERTIFICATE) ||
      !CBB_add_u24_length_prefixed(&body, &certs)) {
    return false;
  }

  if (hs->credential != nullptr) {
    assert(hs->credential->type == SSLCredentialType::kX509);
    STACK_OF(CRYPTO_BUFFER) *chain = hs->credential->chain.get();
    for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(chain); i++) {
      CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(chain, i);
      if (!CBB_add_u24_length_prefixed(&certs, &cert) ||
          !CBB_add_bytes(&cert, CRYPTO_BUFFER_data(buffer),
                         CRYPTO_BUFFER_len(buffer))) {
        return false;
      }
    }
  }

  return ssl_add_message_cbb(hs->ssl, cbb.get());
}